

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

Node * __thiscall Assimp::ColladaLoader::FindNodeBySID(ColladaLoader *this,Node *pNode,string *pSID)

{
  pointer ppNVar1;
  __type _Var2;
  Node *pNVar3;
  size_t a;
  ulong uVar4;
  
  if (pNode == (Node *)0x0) {
LAB_003e2ee1:
    pNVar3 = (Node *)0x0;
  }
  else {
    _Var2 = std::operator==(&pNode->mSID,pSID);
    pNVar3 = pNode;
    if (!_Var2) {
      uVar4 = 0;
      do {
        ppNVar1 = (pNode->mChildren).
                  super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pNode->mChildren).
                          super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) <= uVar4)
        goto LAB_003e2ee1;
        pNVar3 = FindNodeBySID(this,ppNVar1[uVar4],pSID);
        uVar4 = uVar4 + 1;
      } while (pNVar3 == (Node *)0x0);
    }
  }
  return pNVar3;
}

Assistant:

const Collada::Node* ColladaLoader::FindNodeBySID( const Collada::Node* pNode, const std::string& pSID) const {
    if (nullptr == pNode) {
        return nullptr;
    }

    if (pNode->mSID == pSID) {
        return pNode;
    }

    for( size_t a = 0; a < pNode->mChildren.size(); ++a) {
        const Collada::Node* node = FindNodeBySID( pNode->mChildren[a], pSID);
        if (node) {
            return node;
        }
    }

    return nullptr;
}